

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

GetTraceStatsCallbackArgs * __thiscall
perfetto::TracingSession::GetTraceStatsBlocking
          (GetTraceStatsCallbackArgs *__return_storage_ptr__,TracingSession *this)

{
  bool stats_read;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  unique_lock<std::mutex> lock;
  mutex mutex;
  condition_variable cv;
  
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ::std::condition_variable::condition_variable(&cv);
  __return_storage_ptr__->success = false;
  (__return_storage_ptr__->trace_stats_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->trace_stats_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->trace_stats_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stats_read = false;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = operator_new(0x20);
  *(mutex **)local_a8._M_unused._0_8_ = &mutex;
  *(GetTraceStatsCallbackArgs **)((long)local_a8._M_unused._0_8_ + 8) = __return_storage_ptr__;
  *(bool **)((long)local_a8._M_unused._0_8_ + 0x10) = &stats_read;
  *(condition_variable **)((long)local_a8._M_unused._0_8_ + 0x18) = &cv;
  pcStack_90 = std::
               _Function_handler<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:46069:7)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:46069:7)>
             ::_M_manager;
  (*this->_vptr_TracingSession[0xd])(this);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::unique_lock<std::mutex>::unique_lock(&lock,&mutex);
  while (stats_read == false) {
    ::std::condition_variable::wait((unique_lock *)&cv);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  ::std::condition_variable::~condition_variable(&cv);
  return __return_storage_ptr__;
}

Assistant:

TracingSession::GetTraceStatsCallbackArgs
TracingSession::GetTraceStatsBlocking() {
  std::mutex mutex;
  std::condition_variable cv;
  GetTraceStatsCallbackArgs result;
  bool stats_read = false;

  GetTraceStats(
      [&mutex, &result, &stats_read, &cv](GetTraceStatsCallbackArgs args) {
        result = std::move(args);
        std::unique_lock<std::mutex> lock(mutex);
        stats_read = true;
        cv.notify_one();
      });

  {
    std::unique_lock<std::mutex> lock(mutex);
    cv.wait(lock, [&stats_read] { return stats_read; });
  }
  return result;
}